

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

void __thiscall Fl_Input_::put_in_buffer(Fl_Input_ *this,int len)

{
  char *__ptr;
  int iVar1;
  char *__src;
  bool bVar2;
  bool bVar3;
  
  __src = this->value_;
  __ptr = this->buffer;
  iVar1 = this->bufsize;
  if (len < iVar1 && __src == __ptr) {
    __ptr[this->size_] = '\0';
    return;
  }
  if (iVar1 == 0) {
    iVar1 = len + 9;
    if (len <= this->size_) {
      iVar1 = len;
    }
    this->bufsize = iVar1 + 1;
    __ptr = (char *)malloc((long)(iVar1 + 1));
  }
  else {
    if (len < iVar1) goto LAB_001b9f4d;
    bVar2 = __ptr <= __src;
    bVar3 = __src < __ptr + iVar1;
    if (this->size_ < len) {
      do {
        iVar1 = iVar1 * 2;
      } while (iVar1 <= len);
    }
    else {
      iVar1 = len + 1;
    }
    this->bufsize = iVar1;
    __ptr = (char *)realloc(__ptr,(long)iVar1);
    __src = this->value_;
    if (bVar3 && bVar2) {
      __src = __src + ((long)__ptr - (long)this->buffer);
      this->value_ = __src;
    }
  }
  this->buffer = __ptr;
LAB_001b9f4d:
  memmove(__ptr,__src,(long)this->size_);
  this->buffer[this->size_] = '\0';
  this->value_ = this->buffer;
  return;
}

Assistant:

void Fl_Input_::put_in_buffer(int len) {
  if (value_ == buffer && bufsize > len) {
    buffer[size_] = 0;
    return;
  }
  if (!bufsize) {
    if (len > size_) len += 9; // let a few characters insert before realloc
    bufsize = len+1; 
    buffer = (char*)malloc(bufsize);
  } else if (bufsize <= len) {
    // we may need to move old value in case it points into buffer:
    int moveit = (value_ >= buffer && value_ < buffer+bufsize);
    // enlarge current buffer
    if (len > size_) {
      do {bufsize *= 2;} while (bufsize <= len);
    } else {
      bufsize = len+1;
    }
    // Note: the following code is equivalent to:
    //
    //   if (moveit) value_ = value_ - buffer;
    //   char* nbuffer = (char*)realloc(buffer, bufsize);
    //   if (moveit) value_ = value_ + nbuffer;
    //   buffer = nbuffer;
    //
    // We just optimized the pointer arithmetic for value_...
    //
    char* nbuffer = (char*)realloc(buffer, bufsize);
    if (moveit) value_ += (nbuffer-buffer);
    buffer = nbuffer;
  }
  memmove(buffer, value_, size_); buffer[size_] = 0;
  value_ = buffer;
}